

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_27f4c0::PeerManagerImpl::BlockRequestAllowed
          (PeerManagerImpl *this,CBlockIndex *pindex)

{
  int iVar1;
  long lVar2;
  pointer ppCVar3;
  bool bVar4;
  Chainstate *pCVar5;
  CBlockIndex *pCVar6;
  int64_t iVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = ChainstateManager::ActiveChainstate(this->m_chainman);
  iVar1 = pindex->nHeight;
  if (((long)iVar1 < 0) ||
     (ppCVar3 = (pCVar5->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     (int)((ulong)((long)(pCVar5->m_chain).vChain.
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)ppCVar3) >> 3) <= iVar1)) {
    pCVar6 = (CBlockIndex *)0x0;
  }
  else {
    pCVar6 = ppCVar3[iVar1];
  }
  if (pCVar6 == pindex) {
    bVar4 = true;
  }
  else if ((((pindex->nStatus & 7) < 5 || (pindex->nStatus & 0x60) != 0) ||
           (pCVar6 = this->m_chainman->m_best_header, pCVar6 == (CBlockIndex *)0x0)) ||
          (0x278cff < (long)((ulong)pCVar6->nTime - (ulong)pindex->nTime))) {
    bVar4 = false;
  }
  else {
    iVar7 = GetBlockProofEquivalentTime(pCVar6,pindex,pCVar6,&this->m_chainparams->consensus);
    bVar4 = iVar7 < 0x278d00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::BlockRequestAllowed(const CBlockIndex* pindex)
{
    AssertLockHeld(cs_main);
    if (m_chainman.ActiveChain().Contains(pindex)) return true;
    return pindex->IsValid(BLOCK_VALID_SCRIPTS) && (m_chainman.m_best_header != nullptr) &&
           (m_chainman.m_best_header->GetBlockTime() - pindex->GetBlockTime() < STALE_RELAY_AGE_LIMIT) &&
           (GetBlockProofEquivalentTime(*m_chainman.m_best_header, *pindex, *m_chainman.m_best_header, m_chainparams.GetConsensus()) < STALE_RELAY_AGE_LIMIT);
}